

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# carver.cpp
# Opt level: O1

Carver * __thiscall carver::Carver::carveImage(Carver *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  CarveMode CVar2;
  uint uVar3;
  uint uVar4;
  _Alloc_hider _Var5;
  Carver *pCVar6;
  uint uVar7;
  out_of_range *this_00;
  long *plVar8;
  undefined8 *puVar9;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var10;
  _Result<std::vector<int,_std::allocator<int>_>_> *p_Var11;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var12;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar13;
  uint uVar14;
  size_type *psVar15;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar16;
  ulong *puVar17;
  ulong uVar18;
  int iVar19;
  uint uVar20;
  _State_baseV2 *__tmp_1;
  int iVar21;
  Carver *in_RSI;
  undefined8 uVar22;
  vector<int,_std::allocator<int>_> *pvVar23;
  _State_baseV2 *__tmp;
  int iVar24;
  bool bVar25;
  string __str;
  string __str_1;
  shared_ptr<std::__future_base::_State_baseV2> __state;
  future<std::vector<int,_std::allocator<int>_>_> horizontalSeamFuture;
  Mat energyMap;
  future<std::vector<int,_std::allocator<int>_>_> verticalSeamFuture;
  Mat grayscale;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_288;
  long *local_260;
  undefined1 local_258 [8];
  Carver *pCStack_250;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_248 [5];
  string local_1f0;
  string local_1d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b0 [3];
  vector<int,_std::allocator<int>_> local_150;
  string local_138;
  string local_118;
  string local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8 [3];
  vector<int,_std::allocator<int>_> local_78;
  vector<int,_std::allocator<int>_> local_60;
  vector<int,_std::allocator<int>_> local_48;
  
  CVar2 = in_RSI->carveMode_;
  iVar19 = in_RSI->carveCount_;
  if (iVar19 == 0) {
    iVar19 = 0;
    iVar24 = 0;
    if ((CVar2 & ~BOTH) == VERTICAL) {
      iVar24 = (int)((float)in_RSI->imageCols_ * in_RSI->carveAmount_);
    }
    in_RSI->vIterations_ = iVar24;
    if (CVar2 - HORIZONTAL < 2) {
      iVar19 = (int)((float)in_RSI->imageRows_ * in_RSI->carveAmount_);
    }
    in_RSI->hIterations_ = iVar19;
  }
  else {
    iVar24 = 0;
    if ((CVar2 & ~BOTH) == VERTICAL) {
      iVar24 = iVar19;
    }
    iVar21 = 0;
    if (CVar2 - HORIZONTAL < 2) {
      iVar21 = iVar19;
    }
    in_RSI->vIterations_ = iVar24;
    in_RSI->hIterations_ = iVar21;
    if ((in_RSI->imageRows_ <= iVar21) || (in_RSI->imageCols_ <= iVar24)) {
      this_00 = (out_of_range *)__cxa_allocate_exception(0x10);
      std::__cxx11::to_string(&local_1d0,in_RSI->carveCount_);
      std::operator+(&local_288,"Number of pixels to carve ",&local_1d0);
      plVar8 = (long *)std::__cxx11::string::append((char *)&local_288);
      local_2a8._M_dataplus._M_p = (pointer)*plVar8;
      psVar15 = (size_type *)(plVar8 + 2);
      if ((size_type *)local_2a8._M_dataplus._M_p == psVar15) {
        local_2a8.field_2._M_allocated_capacity = *psVar15;
        local_2a8.field_2._8_8_ = plVar8[3];
        local_2a8._M_dataplus._M_p = (pointer)&local_2a8.field_2;
      }
      else {
        local_2a8.field_2._M_allocated_capacity = *psVar15;
      }
      local_2a8._M_string_length = plVar8[1];
      *plVar8 = (long)psVar15;
      plVar8[1] = 0;
      *(undefined1 *)(plVar8 + 2) = 0;
      std::__cxx11::to_string(&local_118,in_RSI->imageCols_);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_258,
                     &local_2a8,&local_118);
      plVar8 = (long *)std::__cxx11::string::append(local_258);
      local_1b0[0]._M_dataplus._M_p = (pointer)*plVar8;
      psVar15 = (size_type *)(plVar8 + 2);
      if ((size_type *)local_1b0[0]._M_dataplus._M_p == psVar15) {
        local_1b0[0].field_2._0_8_ = *psVar15;
        local_1b0[0].field_2._8_8_ = plVar8[3];
        local_1b0[0]._M_dataplus._M_p = (pointer)&local_1b0[0].field_2;
      }
      else {
        local_1b0[0].field_2._0_8_ = *psVar15;
      }
      local_1b0[0]._M_string_length = plVar8[1];
      *plVar8 = (long)psVar15;
      plVar8[1] = 0;
      *(undefined1 *)(plVar8 + 2) = 0;
      std::__cxx11::to_string(&local_1f0,in_RSI->imageRows_);
      std::operator+(local_d8,local_1b0,&local_1f0);
      std::out_of_range::out_of_range(this_00,(string *)local_d8);
      __cxa_throw(this_00,&std::out_of_range::typeinfo,std::out_of_range::~out_of_range);
    }
  }
  uVar3 = in_RSI->vIterations_;
  uVar4 = -uVar3;
  if (0 < (int)uVar3) {
    uVar4 = uVar3;
  }
  uVar20 = 1;
  if (9 < uVar4) {
    uVar18 = (ulong)uVar4;
    uVar7 = 4;
    do {
      uVar20 = uVar7;
      uVar14 = (uint)uVar18;
      if (uVar14 < 100) {
        uVar20 = uVar20 - 2;
        goto LAB_00109b5e;
      }
      if (uVar14 < 1000) {
        uVar20 = uVar20 - 1;
        goto LAB_00109b5e;
      }
      if (uVar14 < 10000) goto LAB_00109b5e;
      uVar18 = uVar18 / 10000;
      uVar7 = uVar20 + 4;
    } while (99999 < uVar14);
    uVar20 = uVar20 + 1;
  }
LAB_00109b5e:
  local_2a8._M_dataplus._M_p = (pointer)&local_2a8.field_2;
  std::__cxx11::string::_M_construct((ulong)&local_2a8,(char)uVar20 - (char)((int)uVar3 >> 0x1f));
  std::__detail::__to_chars_10_impl<unsigned_int>
            (local_2a8._M_dataplus._M_p + (uVar3 >> 0x1f),uVar20,uVar4);
  plVar8 = (long *)std::__cxx11::string::replace((ulong)&local_2a8,0,(char *)0x0,0x10e135);
  local_258 = (undefined1  [8])local_248;
  paVar16 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(plVar8 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar8 == paVar16) {
    local_248[0]._0_8_ = paVar16->_M_allocated_capacity;
    local_248[0]._8_8_ = plVar8[3];
  }
  else {
    local_248[0]._0_8_ = paVar16->_M_allocated_capacity;
    local_258 = (undefined1  [8])*plVar8;
  }
  pCStack_250 = (Carver *)plVar8[1];
  *plVar8 = (long)paVar16;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  plVar8 = (long *)std::__cxx11::string::append(local_258);
  paVar16 = &local_1b0[0].field_2;
  puVar17 = (ulong *)(plVar8 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar8 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar17) {
    local_1b0[0].field_2._0_8_ = *puVar17;
    local_1b0[0].field_2._8_8_ = plVar8[3];
    local_1b0[0]._M_dataplus._M_p = (pointer)paVar16;
  }
  else {
    local_1b0[0].field_2._0_8_ = *puVar17;
    local_1b0[0]._M_dataplus._M_p = (pointer)*plVar8;
  }
  local_1b0[0]._M_string_length = plVar8[1];
  *plVar8 = (long)puVar17;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  uVar3 = in_RSI->hIterations_;
  uVar4 = -uVar3;
  if (0 < (int)uVar3) {
    uVar4 = uVar3;
  }
  uVar20 = 1;
  if (9 < uVar4) {
    uVar18 = (ulong)uVar4;
    uVar7 = 4;
    do {
      uVar20 = uVar7;
      uVar14 = (uint)uVar18;
      if (uVar14 < 100) {
        uVar20 = uVar20 - 2;
        goto LAB_00109cb4;
      }
      if (uVar14 < 1000) {
        uVar20 = uVar20 - 1;
        goto LAB_00109cb4;
      }
      if (uVar14 < 10000) goto LAB_00109cb4;
      uVar18 = uVar18 / 10000;
      uVar7 = uVar20 + 4;
    } while (99999 < uVar14);
    uVar20 = uVar20 + 1;
  }
LAB_00109cb4:
  paVar1 = &local_288.field_2;
  local_288._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct((ulong)&local_288,(char)uVar20 - (char)((int)uVar3 >> 0x1f));
  std::__detail::__to_chars_10_impl<unsigned_int>
            (local_288._M_dataplus._M_p + (uVar3 >> 0x1f),uVar20,uVar4);
  uVar18 = (long)&(((_Vector_base<int,_std::allocator<int>_> *)local_1b0[0]._M_string_length)->
                  _M_impl).super__Vector_impl_data._M_start + local_288._M_string_length;
  uVar22 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b0[0]._M_dataplus._M_p != paVar16) {
    uVar22 = local_1b0[0].field_2._M_allocated_capacity;
  }
  pvVar23 = (vector<int,_std::allocator<int>_> *)local_1b0[0]._M_string_length;
  if ((ulong)uVar22 < uVar18) {
    uVar22 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_288._M_dataplus._M_p != paVar1) {
      uVar22 = local_288.field_2._M_allocated_capacity;
    }
    if (uVar18 <= (ulong)uVar22) {
      puVar9 = (undefined8 *)
               std::__cxx11::string::replace
                         ((ulong)&local_288,0,(char *)0x0,(ulong)local_1b0[0]._M_dataplus._M_p);
      goto LAB_00109d4e;
    }
  }
  puVar9 = (undefined8 *)
           std::__cxx11::string::_M_append((char *)local_1b0,(ulong)local_288._M_dataplus._M_p);
LAB_00109d4e:
  local_d8[0]._M_dataplus._M_p = (pointer)&local_d8[0].field_2;
  psVar15 = puVar9 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar9 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar15) {
    local_d8[0].field_2._0_8_ = *psVar15;
    local_d8[0].field_2._8_8_ = puVar9[3];
  }
  else {
    local_d8[0].field_2._0_8_ = *psVar15;
    local_d8[0]._M_dataplus._M_p = (pointer)*puVar9;
  }
  local_d8[0]._M_string_length = puVar9[1];
  *puVar9 = psVar15;
  puVar9[1] = 0;
  *(undefined1 *)psVar15 = 0;
  plVar8 = (long *)std::__cxx11::string::append((char *)local_d8);
  psVar15 = (size_type *)(plVar8 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar8 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar15) {
    local_138.field_2._M_allocated_capacity = *psVar15;
    local_138.field_2._8_8_ = plVar8[3];
    local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
  }
  else {
    local_138.field_2._M_allocated_capacity = *psVar15;
    local_138._M_dataplus._M_p = (pointer)*plVar8;
  }
  local_138._M_string_length = plVar8[1];
  *plVar8 = (long)psVar15;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  log_(in_RSI,&local_138);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_138._M_dataplus._M_p != &local_138.field_2) {
    operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8[0]._M_dataplus._M_p != &local_d8[0].field_2) {
    operator_delete(local_d8[0]._M_dataplus._M_p,local_d8[0].field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_288._M_dataplus._M_p != paVar1) {
    operator_delete(local_288._M_dataplus._M_p,local_288.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b0[0]._M_dataplus._M_p != paVar16) {
    operator_delete(local_1b0[0]._M_dataplus._M_p,local_1b0[0].field_2._M_allocated_capacity + 1);
  }
  if (local_258 != (undefined1  [8])local_248) {
    operator_delete((void *)local_258,local_248[0]._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2a8._M_dataplus._M_p != &local_2a8.field_2) {
    operator_delete(local_2a8._M_dataplus._M_p,local_2a8.field_2._M_allocated_capacity + 1);
  }
  cv::Mat::Mat((Mat *)local_d8);
  cv::Mat::Mat((Mat *)local_1b0);
  cv::Mat::Mat(&this->originalImage_,&in_RSI->originalImage_);
  iVar24 = 0;
  iVar19 = 0;
  do {
    if ((in_RSI->vIterations_ <= iVar24) && (in_RSI->hIterations_ <= iVar19)) {
      local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"");
      log_(in_RSI,&local_f8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
        operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
      }
      cv::Mat::~Mat((Mat *)local_1b0);
      cv::Mat::~Mat((Mat *)local_d8);
      return this;
    }
    local_248[0]._M_allocated_capacity = 0;
    local_258._0_4_ = 0x1010000;
    local_2a8.field_2._M_allocated_capacity = 0;
    local_2a8._M_dataplus._M_p._0_4_ = 0x2010000;
    local_2a8._M_string_length = (size_type)local_d8;
    pCStack_250 = this;
    cv::cvtColor((cv *)local_258,(_InputArray *)&local_2a8,(_OutputArray *)0x6,0,(int)pvVar23);
    calculateEnergy((Carver *)local_258,&in_RSI->originalImage_);
    cv::Mat::operator=((Mat *)local_1b0,(Mat *)local_258);
    cv::Mat::~Mat((Mat *)local_258);
    if (iVar19 < in_RSI->hIterations_ && iVar24 < in_RSI->vIterations_) {
      local_2a8._M_dataplus._M_p = (pointer)0x0;
      local_2a8._M_string_length = 0;
      local_2a8.field_2._M_allocated_capacity = 0;
      local_288.field_2._M_allocated_capacity = 0;
      local_288._M_dataplus._M_p = (pointer)0x0;
      local_288._M_string_length = 0;
      local_258 = (undefined1  [8])0x0;
      pCStack_250 = (Carver *)0x0;
      p_Var10 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x58);
      p_Var10->_M_use_count = 1;
      p_Var10->_M_weak_count = 1;
      p_Var10->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_001125f8;
      p_Var12 = p_Var10 + 1;
      p_Var10[2]._M_use_count = 0;
      p_Var10[1]._M_use_count = 0;
      p_Var10[1]._M_weak_count = 0;
      *(undefined8 *)((long)&p_Var10[1]._M_weak_count + 1) = 0;
      p_Var10[3]._vptr__Sp_counted_base = (_func_int **)0x0;
      p_Var10[3]._M_use_count = 0;
      p_Var10[1]._vptr__Sp_counted_base = (_func_int **)&PTR___Async_state_impl_00112648;
      p_Var11 = (_Result<std::vector<int,_std::allocator<int>_>_> *)operator_new(0x30);
      std::__future_base::_Result<std::vector<int,_std::allocator<int>_>_>::_Result(p_Var11);
      p_Var10[4]._vptr__Sp_counted_base = (_func_int **)p_Var11;
      *(Carver **)&p_Var10[4]._M_use_count = in_RSI;
      p_Var10[5]._vptr__Sp_counted_base = (_func_int **)local_1b0;
      local_1d0._M_dataplus._M_p = (pointer)0x0;
      local_1f0._M_dataplus._M_p = (pointer)operator_new(0x20);
      *(undefined ***)local_1f0._M_dataplus._M_p = &PTR___State_001126a0;
      *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)((long)local_1f0._M_dataplus._M_p + 8) =
           p_Var12;
      *(code **)((long)local_1f0._M_dataplus._M_p + 0x10) =
           std::__future_base::
           _Async_state_impl<std::thread::_Invoker<std::tuple<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/jjstoo[P]seam-carver/src/carver.cpp:302:42)>_>,_std::vector<int,_std::allocator<int>_>_>
           ::_M_run;
      *(long *)((long)local_1f0._M_dataplus._M_p + 0x18) = 0;
      std::thread::_M_start_thread(&local_1d0,&local_1f0,0);
      if ((long *)local_1f0._M_dataplus._M_p != (long *)0x0) {
        (**(code **)(*(long *)local_1f0._M_dataplus._M_p + 8))();
      }
      pCVar6 = pCStack_250;
      if (p_Var10[3]._vptr__Sp_counted_base != (_func_int **)0x0) {
LAB_0010a6cf:
        std::terminate();
      }
      p_Var10[3]._vptr__Sp_counted_base = (_func_int **)local_1d0._M_dataplus._M_p;
      bVar25 = pCStack_250 != (Carver *)0x0;
      local_258 = (undefined1  [8])p_Var12;
      pCStack_250 = (Carver *)p_Var10;
      if (bVar25) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pCVar6);
      }
      if (local_258 == (undefined1  [8])0x0) {
        p_Var12 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x48);
        p_Var12->_M_use_count = 1;
        p_Var12->_M_weak_count = 1;
        p_Var12->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_001126e0;
        p_Var12[2]._M_use_count = 0;
        p_Var12[1]._M_use_count = 0;
        p_Var12[1]._M_weak_count = 0;
        *(undefined8 *)((long)&p_Var12[1]._M_weak_count + 1) = 0;
        p_Var12[1]._vptr__Sp_counted_base = (_func_int **)&PTR___Deferred_state_00112730;
        p_Var11 = (_Result<std::vector<int,_std::allocator<int>_>_> *)operator_new(0x30);
        std::__future_base::_Result<std::vector<int,_std::allocator<int>_>_>::_Result(p_Var11);
        pCVar6 = pCStack_250;
        p_Var12[3]._vptr__Sp_counted_base = (_func_int **)p_Var11;
        *(Carver **)&p_Var12[3]._M_use_count = in_RSI;
        p_Var12[4]._vptr__Sp_counted_base = (_func_int **)local_1b0;
        bVar25 = pCStack_250 != (Carver *)0x0;
        local_258 = (undefined1  [8])(p_Var12 + 1);
        pCStack_250 = (Carver *)p_Var12;
        if (bVar25) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pCVar6);
        }
      }
      std::__basic_future<std::vector<int,_std::allocator<int>_>_>::__basic_future
                ((__basic_future<std::vector<int,_std::allocator<int>_>_> *)&local_118,
                 (__state_type *)local_258);
      if (pCStack_250 != (Carver *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pCStack_250);
      }
      local_258 = (undefined1  [8])0x0;
      pCStack_250 = (Carver *)0x0;
      pbVar13 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                operator_new(0x58);
      pbVar13->_M_string_length = 0x100000001;
      (pbVar13->_M_dataplus)._M_p = (pointer)&PTR___Sp_counted_ptr_inplace_00112778;
      paVar16 = &pbVar13->field_2;
      *(undefined4 *)&pbVar13[1]._M_string_length = 0;
      *(undefined8 *)((long)&pbVar13->field_2 + 8) = 0;
      *(undefined8 *)((long)&pbVar13->field_2 + 0xd) = 0;
      pbVar13[1].field_2._M_allocated_capacity = 0;
      *(undefined4 *)((long)&pbVar13[1].field_2 + 8) = 0;
      (pbVar13->field_2)._M_allocated_capacity = (size_type)&PTR___Async_state_impl_001127c8;
      p_Var11 = (_Result<std::vector<int,_std::allocator<int>_>_> *)operator_new(0x30);
      std::__future_base::_Result<std::vector<int,_std::allocator<int>_>_>::_Result(p_Var11);
      pbVar13[2]._M_dataplus._M_p = (pointer)p_Var11;
      pbVar13[2]._M_string_length = (size_type)in_RSI;
      pbVar13[2].field_2._M_allocated_capacity = (size_type)local_1b0;
      local_1d0._M_dataplus._M_p = (pointer)0x0;
      local_260 = (long *)operator_new(0x20);
      *local_260 = (long)&PTR___State_00112820;
      local_260[1] = (long)paVar16;
      local_260[2] = (long)std::__future_base::
                           _Async_state_impl<std::thread::_Invoker<std::tuple<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/jjstoo[P]seam-carver/src/carver.cpp:306:42)>_>,_std::vector<int,_std::allocator<int>_>_>
                           ::_M_run;
      local_260[3] = 0;
      std::thread::_M_start_thread(&local_1d0,&local_260,0);
      if (local_260 != (long *)0x0) {
        (**(code **)(*local_260 + 8))();
      }
      pCVar6 = pCStack_250;
      if (pbVar13[1].field_2._M_allocated_capacity != 0) goto LAB_0010a6cf;
      pbVar13[1].field_2._M_allocated_capacity = (size_type)local_1d0._M_dataplus._M_p;
      bVar25 = pCStack_250 != (Carver *)0x0;
      local_258 = (undefined1  [8])paVar16;
      pCStack_250 = (Carver *)pbVar13;
      if (bVar25) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pCVar6);
      }
      if (local_258 == (undefined1  [8])0x0) {
        pbVar13 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  operator_new(0x48);
        pbVar13->_M_string_length = 0x100000001;
        (pbVar13->_M_dataplus)._M_p = (pointer)&PTR___Sp_counted_ptr_inplace_00112860;
        *(undefined4 *)&pbVar13[1]._M_string_length = 0;
        *(undefined8 *)((long)&pbVar13->field_2 + 8) = 0;
        *(undefined8 *)((long)&pbVar13->field_2 + 0xd) = 0;
        (pbVar13->field_2)._M_allocated_capacity = (size_type)&PTR___Deferred_state_001128b0;
        p_Var11 = (_Result<std::vector<int,_std::allocator<int>_>_> *)operator_new(0x30);
        std::__future_base::_Result<std::vector<int,_std::allocator<int>_>_>::_Result(p_Var11);
        pCVar6 = pCStack_250;
        *(_Result<std::vector<int,_std::allocator<int>_>_> **)&pbVar13[1].field_2 = p_Var11;
        *(Carver **)((long)&pbVar13[1].field_2 + 8) = in_RSI;
        pbVar13[2]._M_dataplus._M_p = (pointer)local_1b0;
        bVar25 = pCStack_250 != (Carver *)0x0;
        local_258 = (undefined1  [8])&pbVar13->field_2;
        pCStack_250 = (Carver *)pbVar13;
        if (bVar25) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pCVar6);
        }
      }
      std::__basic_future<std::vector<int,_std::allocator<int>_>_>::__basic_future
                ((__basic_future<std::vector<int,_std::allocator<int>_>_> *)&local_1f0,
                 (__state_type *)local_258);
      if (pCStack_250 != (Carver *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pCStack_250);
      }
      std::future<std::vector<int,_std::allocator<int>_>_>::get
                ((vector<int,_std::allocator<int>_> *)local_258,
                 (future<std::vector<int,_std::allocator<int>_>_> *)&local_118);
      uVar22 = local_2a8.field_2._M_allocated_capacity;
      _Var5._M_p = local_2a8._M_dataplus._M_p;
      local_2a8._M_dataplus._M_p = (pointer)local_258;
      local_2a8._M_string_length = (size_type)pCStack_250;
      local_2a8.field_2._M_allocated_capacity = local_248[0]._M_allocated_capacity;
      local_258 = (undefined1  [8])0x0;
      pCStack_250 = (Carver *)0x0;
      local_248[0]._M_allocated_capacity = 0;
      if (_Var5._M_p != (pointer)0x0) {
        operator_delete(_Var5._M_p,uVar22 - (long)_Var5._M_p);
      }
      if (local_258 != (undefined1  [8])0x0) {
        operator_delete((void *)local_258,local_248[0]._M_allocated_capacity - (long)local_258);
      }
      std::future<std::vector<int,_std::allocator<int>_>_>::get
                ((vector<int,_std::allocator<int>_> *)local_258,
                 (future<std::vector<int,_std::allocator<int>_>_> *)&local_1f0);
      uVar22 = local_288.field_2._M_allocated_capacity;
      _Var5._M_p = local_288._M_dataplus._M_p;
      local_288._M_dataplus._M_p = (pointer)local_258;
      local_288._M_string_length = (size_type)pCStack_250;
      local_288.field_2._M_allocated_capacity = local_248[0]._M_allocated_capacity;
      local_258 = (undefined1  [8])0x0;
      pCStack_250 = (Carver *)0x0;
      local_248[0]._M_allocated_capacity = 0;
      if (_Var5._M_p != (pointer)0x0) {
        operator_delete(_Var5._M_p,uVar22 - (long)_Var5._M_p);
      }
      if (local_258 != (undefined1  [8])0x0) {
        operator_delete((void *)local_258,local_248[0]._M_allocated_capacity - (long)local_258);
      }
      std::vector<int,_std::allocator<int>_>::vector
                (&local_150,(vector<int,_std::allocator<int>_> *)&local_2a8);
      pvVar23 = &local_48;
      pbVar13 = &local_288;
      std::vector<int,_std::allocator<int>_>::vector
                (pvVar23,(vector<int,_std::allocator<int>_> *)pbVar13);
      removeSeams((Carver *)local_258,(Mat *)pbVar13,(vector<int,_std::allocator<int>_> *)this,
                  &local_150);
      cv::Mat::operator=(&this->originalImage_,(Mat *)local_258);
      cv::Mat::~Mat((Mat *)local_258);
      if (local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start != (pointer)0x0) {
        operator_delete(local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      if (local_150.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start != (pointer)0x0) {
        operator_delete(local_150.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_150.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_150.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1f0._M_string_length !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1f0._M_string_length);
      }
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_118._M_string_length !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_118._M_string_length);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_288._M_dataplus._M_p !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) {
        operator_delete(local_288._M_dataplus._M_p,
                        local_288.field_2._M_allocated_capacity - (long)local_288._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2a8._M_dataplus._M_p !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) {
        operator_delete(local_2a8._M_dataplus._M_p,
                        local_2a8.field_2._M_allocated_capacity - (long)local_2a8._M_dataplus._M_p);
      }
      iVar24 = iVar24 + 1;
LAB_0010a505:
      iVar19 = iVar19 + 1;
    }
    else if (iVar24 < in_RSI->vIterations_) {
      pbVar13 = &local_2a8;
      getSeamToRemove((vector<int,_std::allocator<int>_> *)pbVar13,in_RSI,(Mat *)local_1b0,VERTICAL)
      ;
      std::vector<int,_std::allocator<int>_>::vector
                (&local_60,(vector<int,_std::allocator<int>_> *)pbVar13);
      removeVerticalSeam((Carver *)local_258,(Mat *)pbVar13,
                         (vector<int,_std::allocator<int>_> *)this);
      cv::Mat::operator=(&this->originalImage_,(Mat *)local_258);
      cv::Mat::~Mat((Mat *)local_258);
      if (local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start != (pointer)0x0) {
        operator_delete(local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2a8._M_dataplus._M_p !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) {
        operator_delete(local_2a8._M_dataplus._M_p,
                        local_2a8.field_2._M_allocated_capacity - (long)local_2a8._M_dataplus._M_p);
      }
      iVar24 = iVar24 + 1;
    }
    else if (iVar19 < in_RSI->hIterations_) {
      pbVar13 = &local_2a8;
      getSeamToRemove((vector<int,_std::allocator<int>_> *)pbVar13,in_RSI,(Mat *)local_1b0,
                      HORIZONTAL);
      std::vector<int,_std::allocator<int>_>::vector
                (&local_78,(vector<int,_std::allocator<int>_> *)pbVar13);
      removeHorizontalSeam
                ((Carver *)local_258,(Mat *)pbVar13,(vector<int,_std::allocator<int>_> *)this);
      cv::Mat::operator=(&this->originalImage_,(Mat *)local_258);
      cv::Mat::~Mat((Mat *)local_258);
      if (local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start != (pointer)0x0) {
        operator_delete(local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2a8._M_dataplus._M_p !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) {
        operator_delete(local_2a8._M_dataplus._M_p,
                        local_2a8.field_2._M_allocated_capacity - (long)local_2a8._M_dataplus._M_p);
      }
      goto LAB_0010a505;
    }
    printStatus_(in_RSI,iVar19,iVar24);
  } while( true );
}

Assistant:

cv::Mat Carver::carveImage() {
    // Set the iteration counters and max values
    int v = 0;
    int h = 0;

    if (!carveCount_) {
        vIterations_ = carveMode_ == BOTH || carveMode_ == VERTICAL ?
                    static_cast<int>(imageCols_ * carveAmount_) : 0;
        hIterations_ = carveMode_ == BOTH || carveMode_ == HORIZONTAL ?
                    static_cast<int>(imageRows_ * carveAmount_): 0;
    } else {
        vIterations_ = carveMode_ == BOTH || carveMode_ == VERTICAL ?
                    carveCount_ : 0;
        hIterations_ = carveMode_ == BOTH || carveMode_ == HORIZONTAL ?
                    carveCount_ : 0;

        if (!(hIterations_ < imageRows_) || !(vIterations_ < imageCols_))
            throw (out_of_range("Number of pixels to carve " +
                                to_string(carveCount_) +
                                " out of range for image of size " +
                                to_string(imageCols_) + "x" +
                                to_string(imageRows_)));
    }


    log_("Removing " + to_string(vIterations_) + " columns and " +
        to_string(hIterations_) + " rows");

    cv::Mat grayscale;
    cv::Mat energyMap;
    cv::Mat target = originalImage_;

    while(v < vIterations_ || h < hIterations_) {
        cv::cvtColor(target, grayscale, cv::COLOR_BGR2GRAY);
        energyMap = calculateEnergy(grayscale);
        if (v < vIterations_ && h < hIterations_) {
            vector<int> verticalSeam;
            vector<int> horizontalSeam;

            #ifdef CONCURRENT
            // Invoke asynchronous processing for seam pathfinding
            auto verticalSeamFuture =
                    async(launch::async, [this, &energyMap] {
                        return getSeamToRemove(energyMap, VERTICAL);
                    });
            auto horizontalSeamFuture =
                    async(launch::async, [this, &energyMap] {
                        return getSeamToRemove(energyMap, HORIZONTAL);
                    });

            // Synchronize
            verticalSeam = verticalSeamFuture.get();
            horizontalSeam = horizontalSeamFuture.get();

            #else
            verticalSeam = getSeamToRemove(energyMap, VERTICAL);
            horizontalSeam = getSeamToRemove(energyMap, HORIZONTAL);
            #endif

            target = removeSeams(target, verticalSeam, horizontalSeam);
            v++;
            h++;
        } else if (v < vIterations_) {
            vector<int> verticalSeam =
                    getSeamToRemove(energyMap, VERTICAL);
            target = removeVerticalSeam(target, verticalSeam);
            v++;
        } else if (h < hIterations_) {
            vector<int> horizontalSeam =
                    getSeamToRemove(energyMap, HORIZONTAL);
            target = removeHorizontalSeam(target, horizontalSeam);
            h++;
        }
        printStatus_(h, v);
    }
    log_("");
    return target;
}